

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::ExceptionOr<kj::HttpClient::ConnectRequest::Status>::~ExceptionOr
          (ExceptionOr<kj::HttpClient::ConnectRequest::Status> *this)

{
  ExceptionOr<kj::HttpClient::ConnectRequest::Status> *this_local;
  
  Maybe<kj::HttpClient::ConnectRequest::Status>::~Maybe(&this->value);
  ExceptionOrValue::~ExceptionOrValue(&this->super_ExceptionOrValue);
  return;
}

Assistant:

ExceptionOr(T&& value): value(kj::mv(value)) {}